

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

int mdns_socket_setup_ipv4(int sock)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uchar loopback;
  uchar ttl;
  ip_mreq req;
  sockaddr_in saddr;
  undefined1 local_32;
  undefined1 local_31;
  undefined8 local_30;
  sockaddr local_28;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  iVar1 = bind(sock,&local_28,0x10);
  iVar3 = -1;
  if (iVar1 == 0) {
    uVar2 = fcntl(sock,3,0);
    fcntl(sock,4,(ulong)(uVar2 | 0x800));
    local_31 = 1;
    local_32 = 1;
    setsockopt(sock,0,0x21,&local_31,1);
    setsockopt(sock,0,0x22,&local_32,1);
    local_30 = 0xfb0000e0;
    iVar3 = setsockopt(sock,0,0x23,&local_30,8);
    iVar3 = -(uint)(iVar3 != 0);
  }
  return iVar3;
}

Assistant:

int
mdns_socket_setup_ipv4(int sock) {
	struct sockaddr_in saddr;
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr.s_addr = INADDR_ANY;
#ifdef __APPLE__
	saddr.sin_len = sizeof(saddr);
#endif

	if (bind(sock, (struct sockaddr*)&saddr, sizeof(saddr)))
		return -1;

#ifdef _WIN32
	unsigned long param = 1;
	ioctlsocket(sock, FIONBIO, &param);
#else
	const int flags = fcntl(sock, F_GETFL, 0);
	fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif

	unsigned char ttl = 1;
	unsigned char loopback = 1;
	struct ip_mreq req;

	setsockopt(sock, IPPROTO_IP, IP_MULTICAST_TTL, (const char*)&ttl, sizeof(ttl));
	setsockopt(sock, IPPROTO_IP, IP_MULTICAST_LOOP, (const char*)&loopback, sizeof(loopback));

	memset(&req, 0, sizeof(req));
	req.imr_multiaddr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
	req.imr_interface.s_addr = INADDR_ANY;
	if (setsockopt(sock, IPPROTO_IP, IP_ADD_MEMBERSHIP, (char*)&req, sizeof(req)))
		return -1;

	return 0;
}